

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O3

ON_Thickening * __thiscall ON_Thickening::operator=(ON_Thickening *this,ON_Thickening *t)

{
  bool bVar1;
  double d;
  
  if (this != t) {
    bVar1 = On(t);
    SetOn(this,bVar1);
    d = Distance(t);
    SetDistance(this,d);
    bVar1 = Solid(t);
    SetSolid(this,bVar1);
    bVar1 = OffsetOnly(t);
    SetOffsetOnly(this,bVar1);
    bVar1 = BothSides(t);
    SetBothSides(this,bVar1);
  }
  return this;
}

Assistant:

const ON_Thickening& ON_Thickening::operator = (const ON_Thickening& t)
{
  if (this != &t)
  {
    SetOn        (t.On());
    SetDistance  (t.Distance());
    SetSolid     (t.Solid());
    SetOffsetOnly(t.OffsetOnly());
    SetBothSides (t.BothSides());
  }

  return *this;
}